

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_crypto.cpp
# Opt level: O0

void __thiscall
duckdb::EncryptionTransport::EncryptionTransport
          (EncryptionTransport *this,TProtocol *prot_p,string *key,EncryptionUtil *encryption_util_p
          )

{
  element_type *peVar1;
  Allocator *pAVar2;
  undefined8 *in_RCX;
  undefined8 in_RDX;
  _func_int **in_RSI;
  TTransport *in_RDI;
  TProtocol *in_stack_ffffffffffffff88;
  __shared_ptr_access<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_stack_ffffffffffffff90;
  EncryptionTransport *this_00;
  
  duckdb_apache::thrift::transport::TTransport::TTransport(in_RDI);
  in_RDI->_vptr_TTransport = (_func_int **)&PTR__EncryptionTransport_00bffe08;
  in_RDI[1]._vptr_TTransport = in_RSI;
  duckdb_apache::thrift::protocol::TProtocol::getTransport(in_stack_ffffffffffffff88);
  peVar1 = std::
           __shared_ptr_access<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*(in_stack_ffffffffffffff90);
  std::shared_ptr<duckdb_apache::thrift::transport::TTransport>::~shared_ptr
            ((shared_ptr<duckdb_apache::thrift::transport::TTransport> *)0x6286df);
  in_RDI[2]._vptr_TTransport = (_func_int **)peVar1;
  (**(code **)*in_RCX)(in_RDI + 3,in_RCX,in_RDX);
  this_00 = (EncryptionTransport *)(in_RDI + 7);
  pAVar2 = (Allocator *)duckdb::Allocator::DefaultAllocator();
  duckdb::ArenaAllocator::ArenaAllocator((ArenaAllocator *)this_00,pAVar2,0x1000);
  Initialize(this_00,(string *)in_stack_ffffffffffffff88);
  return;
}

Assistant:

EncryptionTransport(TProtocol &prot_p, const string &key, const EncryptionUtil &encryption_util_p)
	    : prot(prot_p), trans(*prot.getTransport()), aes(encryption_util_p.CreateEncryptionState(&key)),
	      allocator(Allocator::DefaultAllocator(), ParquetCrypto::CRYPTO_BLOCK_SIZE) {
		Initialize(key);
	}